

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O2

void __thiscall CVmObjFrameRef::mark_refs(CVmObjFrameRef *this,uint state)

{
  char *pcVar1;
  int iVar2;
  vm_obj_id_t *pvVar3;
  
  pcVar1 = (this->super_CVmObject).ext_;
  if (*(int *)(pcVar1 + 8) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x10),state);
  }
  if (*(int *)(pcVar1 + 0x28) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x30),state);
  }
  if (*(vm_obj_id_t *)(pcVar1 + 0x38) != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x38),state);
  }
  if (*(vm_obj_id_t *)(pcVar1 + 0x3c) != 0) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x3c),state);
  }
  if (*(int *)(pcVar1 + 0x48) == 5) {
    CVmObjTable::add_to_gc_queue(&G_obj_table_X,*(vm_obj_id_t *)(pcVar1 + 0x50),state);
  }
  pvVar3 = (vm_obj_id_t *)(pcVar1 + 0x60);
  for (iVar2 = *(int *)(pcVar1 + 0x24) + *(int *)(pcVar1 + 0x20); 0 < iVar2; iVar2 = iVar2 + -1) {
    if (pvVar3[-2] == 5) {
      CVmObjTable::add_to_gc_queue(&G_obj_table_X,*pvVar3,state);
    }
    pvVar3 = pvVar3 + 4;
  }
  return;
}

Assistant:

void CVmObjFrameRef::mark_refs(VMG_ uint state)
{
    /* get the extension */
    vm_frameref_ext *ext = get_ext();

    /* mark the function */
    if (ext->entry.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->entry.val.obj, state);

    /* mark the method context objects */
    if (ext->self.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->self.val.obj, state);
    if (ext->defobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->defobj, state);
    if (ext->targobj != VM_INVALID_OBJ)
        G_obj_table->mark_all_refs(ext->targobj, state);

    /* mark the invokee */
    if (ext->invokee.typ == VM_OBJ)
        G_obj_table->mark_all_refs(ext->invokee.val.obj, state);

    /* mark each snapshot variable */
    int i;
    const vm_val_t *v;
    for (i = ext->nlocals + ext->nparams, v = ext->vars ; i > 0 ; --i, ++v)
    {
        if (v->typ == VM_OBJ)
            G_obj_table->mark_all_refs(v->val.obj, state);
    }
}